

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

bool ShaderProgramCreate(ShaderProgram *shader_program,string *fragment_source,string *vertex_source
                        ,string *error)

{
  GLuint GVar1;
  int local_b0 [2];
  GLint is_linked;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string shader_prelude;
  string *error_local;
  string *vertex_source_local;
  string *fragment_source_local;
  ShaderProgram *shader_program_local;
  
  shader_prelude.field_2._8_8_ = error;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"#version 150\n",&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 vertex_source);
  GVar1 = ShaderProgramCompile(&local_88,0x8b31,(string *)shader_prelude.field_2._8_8_);
  shader_program->VertexShaderHandle = GVar1;
  std::__cxx11::string::~string((string *)&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is_linked,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 fragment_source);
  GVar1 = ShaderProgramCompile((string *)&is_linked,0x8b30,(string *)shader_prelude.field_2._8_8_);
  shader_program->FragmentShaderHandle = GVar1;
  std::__cxx11::string::~string((string *)&is_linked);
  if ((shader_program->FragmentShaderHandle == 0) || (shader_program->VertexShaderHandle == 0)) {
    ShaderProgramDestroy(shader_program);
    shader_program_local._7_1_ = false;
  }
  else {
    GVar1 = (*glad_glCreateProgram)();
    shader_program->Handle = GVar1;
    (*glad_glAttachShader)(shader_program->Handle,shader_program->VertexShaderHandle);
    (*glad_glAttachShader)(shader_program->Handle,shader_program->FragmentShaderHandle);
    (*glad_glLinkProgram)(shader_program->Handle);
    (*glad_glDeleteShader)(shader_program->FragmentShaderHandle);
    (*glad_glDeleteShader)(shader_program->VertexShaderHandle);
    (*glad_glGetProgramiv)(shader_program->Handle,0x8b82,local_b0);
    if (local_b0[0] == 0) {
      std::__cxx11::string::operator=
                ((string *)shader_prelude.field_2._8_8_,"Error linking program");
      ShaderProgramDestroy(shader_program);
      shader_program_local._7_1_ = false;
    }
    else {
      shader_program_local._7_1_ = true;
    }
  }
  local_b0[1] = 1;
  std::__cxx11::string::~string((string *)local_50);
  return shader_program_local._7_1_;
}

Assistant:

bool ShaderProgramCreate(ShaderProgram& shader_program, const std::string& fragment_source, const std::string& vertex_source, std::string& error) {
    std::string shader_prelude = "#version 150\n";

    shader_program.VertexShaderHandle = ShaderProgramCompile(shader_prelude + vertex_source, GL_VERTEX_SHADER, error);
    shader_program.FragmentShaderHandle = ShaderProgramCompile(shader_prelude + fragment_source, GL_FRAGMENT_SHADER, error);

    if (!shader_program.FragmentShaderHandle || !shader_program.VertexShaderHandle) {
        ShaderProgramDestroy(shader_program);
        return false;
    }

    shader_program.Handle = glCreateProgram();

    glAttachShader(shader_program.Handle, shader_program.VertexShaderHandle);
    glAttachShader(shader_program.Handle, shader_program.FragmentShaderHandle);

    glLinkProgram(shader_program.Handle);

    glDeleteShader(shader_program.FragmentShaderHandle);
    glDeleteShader(shader_program.VertexShaderHandle);

    GLint is_linked;
    glGetProgramiv(shader_program.Handle, GL_LINK_STATUS, &is_linked);

    if (is_linked == GL_FALSE) {
        error = "Error linking program";
        ShaderProgramDestroy(shader_program);
        return false;
    }

    return true;
}